

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_str.c
# Opt level: O0

char * tr_str(TestResult *tr)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *rstr;
  char *exact_msg;
  TestResult *tr_local;
  
  pcVar3 = "";
  if (tr->rtype == CK_ERROR) {
    pcVar3 = "(after this point) ";
  }
  pcVar2 = tr->file;
  uVar1 = tr->line;
  pcVar4 = tr_type_str(tr);
  pcVar3 = ck_strdup_printf("%s:%d:%s:%s:%s:%d: %s%s",pcVar2,(ulong)uVar1,pcVar4,tr->tcname,
                            tr->tname,tr->iter,pcVar3,tr->msg);
  return pcVar3;
}

Assistant:

char *tr_str(TestResult * tr)
{
    const char *exact_msg;
    char *rstr;

    exact_msg = (tr->rtype == CK_ERROR) ? "(after this point) " : "";

    rstr = ck_strdup_printf("%s:%d:%s:%s:%s:%d: %s%s",
                            tr->file, tr->line,
                            tr_type_str(tr), tr->tcname, tr->tname, tr->iter,
                            exact_msg, tr->msg);

    return rstr;
}